

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_order.cpp
# Opt level: O1

unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>,_true> __thiscall
duckdb::PhysicalOrder::GetGlobalSinkState(PhysicalOrder *this,ClientContext *context)

{
  bool bVar1;
  _Head_base<0UL,_duckdb::OrderGlobalSinkState_*,_false> _Var2;
  OrderGlobalSinkState *this_00;
  ClientConfig *pCVar3;
  pointer pOVar4;
  idx_t iVar5;
  ClientContext *in_RDX;
  templated_unique_single_t state;
  RowLayout payload_layout;
  _Head_base<0UL,_duckdb::OrderGlobalSinkState_*,_false> local_a0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_98;
  RowLayout local_80;
  
  RowLayout::RowLayout(&local_80);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_98,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &context->registered_state);
  RowLayout::Initialize(&local_80,(vector<duckdb::LogicalType,_true> *)&local_98,true);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_98);
  this_00 = (OrderGlobalSinkState *)operator_new(800);
  OrderGlobalSinkState::OrderGlobalSinkState(this_00,in_RDX,(PhysicalOrder *)context,&local_80);
  local_a0._M_head_impl = this_00;
  pCVar3 = ClientConfig::GetConfig(in_RDX);
  bVar1 = pCVar3->force_external;
  pOVar4 = unique_ptr<duckdb::OrderGlobalSinkState,_std::default_delete<duckdb::OrderGlobalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::OrderGlobalSinkState,_std::default_delete<duckdb::OrderGlobalSinkState>,_true>
                         *)&local_a0);
  (pOVar4->global_sort_state).external = bVar1;
  iVar5 = PhysicalOperator::GetMaxThreadMemory(in_RDX);
  pOVar4 = unique_ptr<duckdb::OrderGlobalSinkState,_std::default_delete<duckdb::OrderGlobalSinkState>,_true>
           ::operator->((unique_ptr<duckdb::OrderGlobalSinkState,_std::default_delete<duckdb::OrderGlobalSinkState>,_true>
                         *)&local_a0);
  _Var2._M_head_impl = local_a0._M_head_impl;
  pOVar4->memory_per_thread = iVar5;
  local_a0._M_head_impl = (OrderGlobalSinkState *)0x0;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator = (_func_int **)_Var2._M_head_impl;
  if (local_80.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_80);
  return (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)
         (unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>)this;
}

Assistant:

unique_ptr<GlobalSinkState> PhysicalOrder::GetGlobalSinkState(ClientContext &context) const {
	// Get the payload layout from the return types
	RowLayout payload_layout;
	payload_layout.Initialize(types);
	auto state = make_uniq<OrderGlobalSinkState>(context, *this, payload_layout);
	// Set external (can be force with the PRAGMA)
	state->global_sort_state.external = ClientConfig::GetConfig(context).force_external;
	state->memory_per_thread = GetMaxThreadMemory(context);
	return std::move(state);
}